

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Hash_SHA3.c
# Opt level: O0

void Hacl_Hash_SHA3_update_last_sha3
               (Spec_Hash_Definitions_hash_alg a,uint64_t *s,uint8_t *input,uint32_t input_len)

{
  uint32_t uVar1;
  uint64_t uVar2;
  uint8_t *b0;
  uint8_t *b3;
  uint8_t b2 [256];
  uint64_t c_1;
  uint64_t v4_9;
  uint64_t v3_9;
  uint64_t v2_9;
  uint64_t v1_9;
  uint64_t v0_9;
  uint64_t v4_8;
  uint64_t v3_8;
  uint64_t v2_8;
  uint64_t v1_8;
  uint64_t v0_8;
  uint64_t v4_7;
  uint64_t v3_7;
  uint64_t v2_7;
  uint64_t v1_7;
  uint64_t v0_7;
  uint64_t v4_6;
  uint64_t v3_6;
  uint64_t v2_6;
  uint64_t v1_6;
  uint64_t v0_6;
  uint64_t v4_5;
  uint64_t v3_5;
  uint64_t v2_5;
  uint64_t v1_5;
  uint64_t v0_5;
  uint32_t i_17;
  uint64_t uu____3;
  uint64_t temp_1;
  uint32_t r_1;
  uint32_t _Y_1;
  uint32_t i_16;
  uint64_t current_1;
  uint64_t x_1;
  uint32_t i_15;
  uint64_t _D_9;
  uint64_t uu____2_4;
  uint32_t i_14;
  uint64_t _D_8;
  uint64_t uu____2_3;
  uint32_t i_13;
  uint64_t _D_7;
  uint64_t uu____2_2;
  uint32_t i_12;
  uint64_t _D_6;
  uint64_t uu____2_1;
  uint32_t i_11;
  uint64_t _D_5;
  uint64_t uu____2;
  uint32_t i1_1;
  uint32_t i_10;
  uint64_t _C_1 [5];
  uint local_aa4;
  uint32_t i0_1;
  uint32_t i_9;
  uint64_t u30;
  uint64_t u29;
  uint64_t u28;
  uint64_t u27;
  uint64_t u26;
  uint64_t u25;
  uint64_t u24;
  uint64_t u23;
  uint64_t u22;
  uint64_t u21;
  uint64_t u20;
  uint64_t u19;
  uint64_t u18;
  uint64_t u17;
  uint64_t u16;
  uint64_t u15;
  uint64_t u14;
  uint64_t u13;
  uint64_t u12;
  uint64_t u11;
  uint64_t u10;
  uint64_t u9;
  uint64_t u8;
  uint64_t u7;
  uint64_t u6;
  uint64_t u5;
  uint64_t u4;
  uint64_t u3;
  uint64_t u2;
  uint64_t u1;
  uint64_t u0;
  uint64_t u;
  uint8_t *b;
  uint64_t ws [32];
  uint8_t *b01;
  uint8_t *bl0;
  uint8_t *b00;
  uint32_t rem;
  uint8_t *b_;
  uint8_t b1 [256];
  uint8_t *b0_1;
  uint8_t *b4;
  uint8_t b3_1 [256];
  uint64_t c;
  uint64_t v4_4;
  uint64_t v3_4;
  uint64_t v2_4;
  uint64_t v1_4;
  uint64_t v0_4;
  uint64_t v4_3;
  uint64_t v3_3;
  uint64_t v2_3;
  uint64_t v1_3;
  uint64_t v0_3;
  uint64_t v4_2;
  uint64_t v3_2;
  uint64_t v2_2;
  uint64_t v1_2;
  uint64_t v0_2;
  uint64_t v4_1;
  uint64_t v3_1;
  uint64_t v2_1;
  uint64_t v1_1;
  uint64_t v0_1;
  uint64_t v4;
  uint64_t v3;
  uint64_t v2;
  uint64_t v1;
  uint64_t v0;
  uint32_t i_8;
  uint64_t uu____1;
  uint64_t temp;
  uint32_t r;
  uint32_t _Y;
  uint32_t i_7;
  uint64_t current;
  uint64_t x;
  uint32_t i_6;
  uint64_t _D_4;
  uint64_t uu____0_4;
  uint32_t i_5;
  uint64_t _D_3;
  uint64_t uu____0_3;
  uint32_t i_4;
  uint64_t _D_2;
  uint64_t uu____0_2;
  uint32_t i_3;
  uint64_t _D_1;
  uint64_t uu____0_1;
  uint32_t i_2;
  uint64_t _D;
  uint64_t uu____0;
  uint32_t i1;
  uint32_t i_1;
  uint64_t _C [5];
  uint local_494;
  uint32_t i0;
  uint32_t i;
  uint64_t u30_1;
  uint64_t u29_1;
  uint64_t u28_1;
  uint64_t u27_1;
  uint64_t u26_1;
  uint64_t u25_1;
  uint64_t u24_1;
  uint64_t u23_1;
  uint64_t u22_1;
  uint64_t u21_1;
  uint64_t u20_1;
  uint64_t u19_1;
  uint64_t u18_1;
  uint64_t u17_1;
  uint64_t u16_1;
  uint64_t u15_1;
  uint64_t u14_1;
  uint64_t u13_1;
  uint64_t u12_1;
  uint64_t u11_1;
  uint64_t u10_1;
  uint64_t u9_1;
  uint64_t u8_1;
  uint64_t u7_1;
  uint64_t u6_1;
  uint64_t u5_1;
  uint64_t u4_1;
  uint64_t u3_1;
  uint64_t u2_1;
  uint64_t u1_1;
  uint64_t u0_1;
  uint64_t u_1;
  uint8_t *b_1;
  uint64_t ws_1 [32];
  uint8_t *b02;
  uint8_t *bl0_1;
  uint8_t *b01_1;
  uint32_t rem_1;
  uint8_t *b_0;
  uint8_t b2_1 [256];
  uint8_t *bl00;
  uint8_t *b00_1;
  uint8_t *b__1;
  uint8_t b1_1 [256];
  uint8_t local_25;
  uint32_t len;
  uint8_t suffix;
  uint32_t input_len_local;
  uint8_t *input_local;
  uint64_t *s_local;
  Spec_Hash_Definitions_hash_alg a_local;
  
  if ((a == '\f') || (a == '\r')) {
    local_25 = '\x1f';
  }
  else {
    local_25 = '\x06';
  }
  uVar1 = block_len(a);
  if (input_len == uVar1) {
    memset(&b__1,0,0x100);
    memcpy(&b__1,input,(ulong)uVar1);
    absorb_inner_32((uint8_t *)&b__1,s);
    memset(&b_0,0,0x100);
    memcpy(&b_0,input + ((ulong)input_len - 0U % (ulong)uVar1),0U % (ulong)uVar1);
    *(uint8_t *)((long)&b_0 + 0U % (ulong)uVar1) = local_25;
    memset(&b_1,0,0x100);
    uVar2 = load64((uint8_t *)&b_0);
    b_1 = (uint8_t *)__uint64_identity(uVar2);
    uVar2 = load64(b2_1);
    ws_1[0] = __uint64_identity(uVar2);
    uVar2 = load64(b2_1 + 8);
    ws_1[1] = __uint64_identity(uVar2);
    uVar2 = load64(b2_1 + 0x10);
    ws_1[2] = __uint64_identity(uVar2);
    uVar2 = load64(b2_1 + 0x18);
    ws_1[3] = __uint64_identity(uVar2);
    uVar2 = load64(b2_1 + 0x20);
    ws_1[4] = __uint64_identity(uVar2);
    uVar2 = load64(b2_1 + 0x28);
    ws_1[5] = __uint64_identity(uVar2);
    uVar2 = load64(b2_1 + 0x30);
    ws_1[6] = __uint64_identity(uVar2);
    uVar2 = load64(b2_1 + 0x38);
    ws_1[7] = __uint64_identity(uVar2);
    uVar2 = load64(b2_1 + 0x40);
    ws_1[8] = __uint64_identity(uVar2);
    uVar2 = load64(b2_1 + 0x48);
    ws_1[9] = __uint64_identity(uVar2);
    uVar2 = load64(b2_1 + 0x50);
    ws_1[10] = __uint64_identity(uVar2);
    uVar2 = load64(b2_1 + 0x58);
    ws_1[0xb] = __uint64_identity(uVar2);
    uVar2 = load64(b2_1 + 0x60);
    ws_1[0xc] = __uint64_identity(uVar2);
    uVar2 = load64(b2_1 + 0x68);
    ws_1[0xd] = __uint64_identity(uVar2);
    uVar2 = load64(b2_1 + 0x70);
    ws_1[0xe] = __uint64_identity(uVar2);
    uVar2 = load64(b2_1 + 0x78);
    ws_1[0xf] = __uint64_identity(uVar2);
    uVar2 = load64(b2_1 + 0x80);
    ws_1[0x10] = __uint64_identity(uVar2);
    uVar2 = load64(b2_1 + 0x88);
    ws_1[0x11] = __uint64_identity(uVar2);
    uVar2 = load64(b2_1 + 0x90);
    ws_1[0x12] = __uint64_identity(uVar2);
    uVar2 = load64(b2_1 + 0x98);
    ws_1[0x13] = __uint64_identity(uVar2);
    uVar2 = load64(b2_1 + 0xa0);
    ws_1[0x14] = __uint64_identity(uVar2);
    uVar2 = load64(b2_1 + 0xa8);
    ws_1[0x15] = __uint64_identity(uVar2);
    uVar2 = load64(b2_1 + 0xb0);
    ws_1[0x16] = __uint64_identity(uVar2);
    uVar2 = load64(b2_1 + 0xb8);
    ws_1[0x17] = __uint64_identity(uVar2);
    uVar2 = load64(b2_1 + 0xc0);
    ws_1[0x18] = __uint64_identity(uVar2);
    uVar2 = load64(b2_1 + 200);
    ws_1[0x19] = __uint64_identity(uVar2);
    uVar2 = load64(b2_1 + 0xd0);
    ws_1[0x1a] = __uint64_identity(uVar2);
    uVar2 = load64(b2_1 + 0xd8);
    ws_1[0x1b] = __uint64_identity(uVar2);
    uVar2 = load64(b2_1 + 0xe0);
    ws_1[0x1c] = __uint64_identity(uVar2);
    uVar2 = load64(b2_1 + 0xe8);
    ws_1[0x1d] = __uint64_identity(uVar2);
    uVar2 = load64(b2_1 + 0xf0);
    ws_1[0x1e] = __uint64_identity(uVar2);
    for (local_494 = 0; local_494 < 0x19; local_494 = local_494 + 1) {
      s[local_494] = s[local_494] ^ ws_1[(ulong)local_494 - 1];
    }
    memset(&b4,0,0x100);
    b1._248_8_ = &b4;
    *(uint8_t *)(b1._248_8_ + (ulong)(uVar1 - 1)) = 0x80;
    absorb_inner_32((uint8_t *)b1._248_8_,s);
  }
  else {
    memset(&b_,0,0x100);
    memcpy(&b_,input + ((ulong)input_len - (ulong)(input_len % uVar1)),(ulong)(input_len % uVar1));
    *(uint8_t *)((long)&b_ + (ulong)input_len % (ulong)uVar1) = local_25;
    memset(&b,0,0x100);
    uVar2 = load64((uint8_t *)&b_);
    b = (uint8_t *)__uint64_identity(uVar2);
    uVar2 = load64(b1);
    ws[0] = __uint64_identity(uVar2);
    uVar2 = load64(b1 + 8);
    ws[1] = __uint64_identity(uVar2);
    uVar2 = load64(b1 + 0x10);
    ws[2] = __uint64_identity(uVar2);
    uVar2 = load64(b1 + 0x18);
    ws[3] = __uint64_identity(uVar2);
    uVar2 = load64(b1 + 0x20);
    ws[4] = __uint64_identity(uVar2);
    uVar2 = load64(b1 + 0x28);
    ws[5] = __uint64_identity(uVar2);
    uVar2 = load64(b1 + 0x30);
    ws[6] = __uint64_identity(uVar2);
    uVar2 = load64(b1 + 0x38);
    ws[7] = __uint64_identity(uVar2);
    uVar2 = load64(b1 + 0x40);
    ws[8] = __uint64_identity(uVar2);
    uVar2 = load64(b1 + 0x48);
    ws[9] = __uint64_identity(uVar2);
    uVar2 = load64(b1 + 0x50);
    ws[10] = __uint64_identity(uVar2);
    uVar2 = load64(b1 + 0x58);
    ws[0xb] = __uint64_identity(uVar2);
    uVar2 = load64(b1 + 0x60);
    ws[0xc] = __uint64_identity(uVar2);
    uVar2 = load64(b1 + 0x68);
    ws[0xd] = __uint64_identity(uVar2);
    uVar2 = load64(b1 + 0x70);
    ws[0xe] = __uint64_identity(uVar2);
    uVar2 = load64(b1 + 0x78);
    ws[0xf] = __uint64_identity(uVar2);
    uVar2 = load64(b1 + 0x80);
    ws[0x10] = __uint64_identity(uVar2);
    uVar2 = load64(b1 + 0x88);
    ws[0x11] = __uint64_identity(uVar2);
    uVar2 = load64(b1 + 0x90);
    ws[0x12] = __uint64_identity(uVar2);
    uVar2 = load64(b1 + 0x98);
    ws[0x13] = __uint64_identity(uVar2);
    uVar2 = load64(b1 + 0xa0);
    ws[0x14] = __uint64_identity(uVar2);
    uVar2 = load64(b1 + 0xa8);
    ws[0x15] = __uint64_identity(uVar2);
    uVar2 = load64(b1 + 0xb0);
    ws[0x16] = __uint64_identity(uVar2);
    uVar2 = load64(b1 + 0xb8);
    ws[0x17] = __uint64_identity(uVar2);
    uVar2 = load64(b1 + 0xc0);
    ws[0x18] = __uint64_identity(uVar2);
    uVar2 = load64(b1 + 200);
    ws[0x19] = __uint64_identity(uVar2);
    uVar2 = load64(b1 + 0xd0);
    ws[0x1a] = __uint64_identity(uVar2);
    uVar2 = load64(b1 + 0xd8);
    ws[0x1b] = __uint64_identity(uVar2);
    uVar2 = load64(b1 + 0xe0);
    ws[0x1c] = __uint64_identity(uVar2);
    uVar2 = load64(b1 + 0xe8);
    ws[0x1d] = __uint64_identity(uVar2);
    uVar2 = load64(b1 + 0xf0);
    ws[0x1e] = __uint64_identity(uVar2);
    for (local_aa4 = 0; local_aa4 < 0x19; local_aa4 = local_aa4 + 1) {
      s[local_aa4] = s[local_aa4] ^ ws[(ulong)local_aa4 - 1];
    }
    memset(&b3,0,0x100);
    *(uint8_t *)((long)&b3 + (ulong)(uVar1 - 1)) = 0x80;
    absorb_inner_32((uint8_t *)&b3,s);
  }
  return;
}

Assistant:

void
Hacl_Hash_SHA3_update_last_sha3(
  Spec_Hash_Definitions_hash_alg a,
  uint64_t *s,
  uint8_t *input,
  uint32_t input_len
)
{
  uint8_t suffix;
  if (a == Spec_Hash_Definitions_Shake128 || a == Spec_Hash_Definitions_Shake256)
  {
    suffix = 0x1fU;
  }
  else
  {
    suffix = 0x06U;
  }
  uint32_t len = block_len(a);
  if (input_len == len)
  {
    uint8_t b1[256U] = { 0U };
    uint8_t *b_ = b1;
    uint8_t *b00 = input;
    uint8_t *bl00 = b_;
    memcpy(bl00, b00 + 0U * len, len * sizeof (uint8_t));
    absorb_inner_32(b_, s);
    uint8_t b2[256U] = { 0U };
    uint8_t *b_0 = b2;
    uint32_t rem = 0U % len;
    uint8_t *b01 = input + input_len;
    uint8_t *bl0 = b_0;
    memcpy(bl0, b01 + 0U - rem, rem * sizeof (uint8_t));
    uint8_t *b02 = b_0;
    b02[0U % len] = suffix;
    uint64_t ws[32U] = { 0U };
    uint8_t *b = b_0;
    uint64_t u = load64_le(b);
    ws[0U] = u;
    uint64_t u0 = load64_le(b + 8U);
    ws[1U] = u0;
    uint64_t u1 = load64_le(b + 16U);
    ws[2U] = u1;
    uint64_t u2 = load64_le(b + 24U);
    ws[3U] = u2;
    uint64_t u3 = load64_le(b + 32U);
    ws[4U] = u3;
    uint64_t u4 = load64_le(b + 40U);
    ws[5U] = u4;
    uint64_t u5 = load64_le(b + 48U);
    ws[6U] = u5;
    uint64_t u6 = load64_le(b + 56U);
    ws[7U] = u6;
    uint64_t u7 = load64_le(b + 64U);
    ws[8U] = u7;
    uint64_t u8 = load64_le(b + 72U);
    ws[9U] = u8;
    uint64_t u9 = load64_le(b + 80U);
    ws[10U] = u9;
    uint64_t u10 = load64_le(b + 88U);
    ws[11U] = u10;
    uint64_t u11 = load64_le(b + 96U);
    ws[12U] = u11;
    uint64_t u12 = load64_le(b + 104U);
    ws[13U] = u12;
    uint64_t u13 = load64_le(b + 112U);
    ws[14U] = u13;
    uint64_t u14 = load64_le(b + 120U);
    ws[15U] = u14;
    uint64_t u15 = load64_le(b + 128U);
    ws[16U] = u15;
    uint64_t u16 = load64_le(b + 136U);
    ws[17U] = u16;
    uint64_t u17 = load64_le(b + 144U);
    ws[18U] = u17;
    uint64_t u18 = load64_le(b + 152U);
    ws[19U] = u18;
    uint64_t u19 = load64_le(b + 160U);
    ws[20U] = u19;
    uint64_t u20 = load64_le(b + 168U);
    ws[21U] = u20;
    uint64_t u21 = load64_le(b + 176U);
    ws[22U] = u21;
    uint64_t u22 = load64_le(b + 184U);
    ws[23U] = u22;
    uint64_t u23 = load64_le(b + 192U);
    ws[24U] = u23;
    uint64_t u24 = load64_le(b + 200U);
    ws[25U] = u24;
    uint64_t u25 = load64_le(b + 208U);
    ws[26U] = u25;
    uint64_t u26 = load64_le(b + 216U);
    ws[27U] = u26;
    uint64_t u27 = load64_le(b + 224U);
    ws[28U] = u27;
    uint64_t u28 = load64_le(b + 232U);
    ws[29U] = u28;
    uint64_t u29 = load64_le(b + 240U);
    ws[30U] = u29;
    uint64_t u30 = load64_le(b + 248U);
    ws[31U] = u30;
    for (uint32_t i = 0U; i < 25U; i++)
    {
      s[i] = s[i] ^ ws[i];
    }
    if (!(((uint32_t)suffix & 0x80U) == 0U) && 0U % len == len - 1U)
    {
      for (uint32_t i0 = 0U; i0 < 24U; i0++)
      {
        uint64_t _C[5U] = { 0U };
        KRML_MAYBE_FOR5(i,
          0U,
          5U,
          1U,
          _C[i] = s[i + 0U] ^ (s[i + 5U] ^ (s[i + 10U] ^ (s[i + 15U] ^ s[i + 20U]))););
        KRML_MAYBE_FOR5(i1,
          0U,
          5U,
          1U,
          uint64_t uu____0 = _C[(i1 + 1U) % 5U];
          uint64_t _D = _C[(i1 + 4U) % 5U] ^ (uu____0 << 1U | uu____0 >> 63U);
          KRML_MAYBE_FOR5(i, 0U, 5U, 1U, s[i1 + 5U * i] = s[i1 + 5U * i] ^ _D;););
        uint64_t x = s[1U];
        uint64_t current = x;
        for (uint32_t i = 0U; i < 24U; i++)
        {
          uint32_t _Y = Hacl_Hash_SHA3_keccak_piln[i];
          uint32_t r = Hacl_Hash_SHA3_keccak_rotc[i];
          uint64_t temp = s[_Y];
          uint64_t uu____1 = current;
          s[_Y] = uu____1 << r | uu____1 >> (64U - r);
          current = temp;
        }
        KRML_MAYBE_FOR5(i,
          0U,
          5U,
          1U,
          uint64_t v0 = s[0U + 5U * i] ^ (~s[1U + 5U * i] & s[2U + 5U * i]);
          uint64_t v1 = s[1U + 5U * i] ^ (~s[2U + 5U * i] & s[3U + 5U * i]);
          uint64_t v2 = s[2U + 5U * i] ^ (~s[3U + 5U * i] & s[4U + 5U * i]);
          uint64_t v3 = s[3U + 5U * i] ^ (~s[4U + 5U * i] & s[0U + 5U * i]);
          uint64_t v4 = s[4U + 5U * i] ^ (~s[0U + 5U * i] & s[1U + 5U * i]);
          s[0U + 5U * i] = v0;
          s[1U + 5U * i] = v1;
          s[2U + 5U * i] = v2;
          s[3U + 5U * i] = v3;
          s[4U + 5U * i] = v4;);
        uint64_t c = Hacl_Hash_SHA3_keccak_rndc[i0];
        s[0U] = s[0U] ^ c;
      }
    }
    uint8_t b3[256U] = { 0U };
    uint8_t *b4 = b3;
    uint8_t *b0 = b4;
    b0[len - 1U] = 0x80U;
    absorb_inner_32(b4, s);
    return;
  }
  uint8_t b1[256U] = { 0U };
  uint8_t *b_ = b1;
  uint32_t rem = input_len % len;
  uint8_t *b00 = input;
  uint8_t *bl0 = b_;
  memcpy(bl0, b00 + input_len - rem, rem * sizeof (uint8_t));
  uint8_t *b01 = b_;
  b01[input_len % len] = suffix;
  uint64_t ws[32U] = { 0U };
  uint8_t *b = b_;
  uint64_t u = load64_le(b);
  ws[0U] = u;
  uint64_t u0 = load64_le(b + 8U);
  ws[1U] = u0;
  uint64_t u1 = load64_le(b + 16U);
  ws[2U] = u1;
  uint64_t u2 = load64_le(b + 24U);
  ws[3U] = u2;
  uint64_t u3 = load64_le(b + 32U);
  ws[4U] = u3;
  uint64_t u4 = load64_le(b + 40U);
  ws[5U] = u4;
  uint64_t u5 = load64_le(b + 48U);
  ws[6U] = u5;
  uint64_t u6 = load64_le(b + 56U);
  ws[7U] = u6;
  uint64_t u7 = load64_le(b + 64U);
  ws[8U] = u7;
  uint64_t u8 = load64_le(b + 72U);
  ws[9U] = u8;
  uint64_t u9 = load64_le(b + 80U);
  ws[10U] = u9;
  uint64_t u10 = load64_le(b + 88U);
  ws[11U] = u10;
  uint64_t u11 = load64_le(b + 96U);
  ws[12U] = u11;
  uint64_t u12 = load64_le(b + 104U);
  ws[13U] = u12;
  uint64_t u13 = load64_le(b + 112U);
  ws[14U] = u13;
  uint64_t u14 = load64_le(b + 120U);
  ws[15U] = u14;
  uint64_t u15 = load64_le(b + 128U);
  ws[16U] = u15;
  uint64_t u16 = load64_le(b + 136U);
  ws[17U] = u16;
  uint64_t u17 = load64_le(b + 144U);
  ws[18U] = u17;
  uint64_t u18 = load64_le(b + 152U);
  ws[19U] = u18;
  uint64_t u19 = load64_le(b + 160U);
  ws[20U] = u19;
  uint64_t u20 = load64_le(b + 168U);
  ws[21U] = u20;
  uint64_t u21 = load64_le(b + 176U);
  ws[22U] = u21;
  uint64_t u22 = load64_le(b + 184U);
  ws[23U] = u22;
  uint64_t u23 = load64_le(b + 192U);
  ws[24U] = u23;
  uint64_t u24 = load64_le(b + 200U);
  ws[25U] = u24;
  uint64_t u25 = load64_le(b + 208U);
  ws[26U] = u25;
  uint64_t u26 = load64_le(b + 216U);
  ws[27U] = u26;
  uint64_t u27 = load64_le(b + 224U);
  ws[28U] = u27;
  uint64_t u28 = load64_le(b + 232U);
  ws[29U] = u28;
  uint64_t u29 = load64_le(b + 240U);
  ws[30U] = u29;
  uint64_t u30 = load64_le(b + 248U);
  ws[31U] = u30;
  for (uint32_t i = 0U; i < 25U; i++)
  {
    s[i] = s[i] ^ ws[i];
  }
  if (!(((uint32_t)suffix & 0x80U) == 0U) && input_len % len == len - 1U)
  {
    for (uint32_t i0 = 0U; i0 < 24U; i0++)
    {
      uint64_t _C[5U] = { 0U };
      KRML_MAYBE_FOR5(i,
        0U,
        5U,
        1U,
        _C[i] = s[i + 0U] ^ (s[i + 5U] ^ (s[i + 10U] ^ (s[i + 15U] ^ s[i + 20U]))););
      KRML_MAYBE_FOR5(i1,
        0U,
        5U,
        1U,
        uint64_t uu____2 = _C[(i1 + 1U) % 5U];
        uint64_t _D = _C[(i1 + 4U) % 5U] ^ (uu____2 << 1U | uu____2 >> 63U);
        KRML_MAYBE_FOR5(i, 0U, 5U, 1U, s[i1 + 5U * i] = s[i1 + 5U * i] ^ _D;););
      uint64_t x = s[1U];
      uint64_t current = x;
      for (uint32_t i = 0U; i < 24U; i++)
      {
        uint32_t _Y = Hacl_Hash_SHA3_keccak_piln[i];
        uint32_t r = Hacl_Hash_SHA3_keccak_rotc[i];
        uint64_t temp = s[_Y];
        uint64_t uu____3 = current;
        s[_Y] = uu____3 << r | uu____3 >> (64U - r);
        current = temp;
      }
      KRML_MAYBE_FOR5(i,
        0U,
        5U,
        1U,
        uint64_t v0 = s[0U + 5U * i] ^ (~s[1U + 5U * i] & s[2U + 5U * i]);
        uint64_t v1 = s[1U + 5U * i] ^ (~s[2U + 5U * i] & s[3U + 5U * i]);
        uint64_t v2 = s[2U + 5U * i] ^ (~s[3U + 5U * i] & s[4U + 5U * i]);
        uint64_t v3 = s[3U + 5U * i] ^ (~s[4U + 5U * i] & s[0U + 5U * i]);
        uint64_t v4 = s[4U + 5U * i] ^ (~s[0U + 5U * i] & s[1U + 5U * i]);
        s[0U + 5U * i] = v0;
        s[1U + 5U * i] = v1;
        s[2U + 5U * i] = v2;
        s[3U + 5U * i] = v3;
        s[4U + 5U * i] = v4;);
      uint64_t c = Hacl_Hash_SHA3_keccak_rndc[i0];
      s[0U] = s[0U] ^ c;
    }
  }
  uint8_t b2[256U] = { 0U };
  uint8_t *b3 = b2;
  uint8_t *b0 = b3;
  b0[len - 1U] = 0x80U;
  absorb_inner_32(b3, s);
}